

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

void fmt::v7::detail::
     value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
     format_custom_arg<baryonyx::solver_parameters::mode_type,fmt::v7::formatter<baryonyx::solver_parameters::mode_type,char,void>>
               (void *arg,parse_context_type *parse_ctx,
               basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx)

{
  size_t *psVar1;
  char *pcVar2;
  iterator pcVar3;
  long lVar4;
  iterator iVar5;
  formatter<baryonyx::solver_parameters::mode_type,_char,_void> f;
  undefined8 local_58;
  undefined4 local_50;
  undefined2 local_4c;
  undefined1 local_4a;
  undefined4 local_48;
  undefined4 local_40;
  undefined4 local_30;
  undefined4 local_28;
  
  local_58 = 0xffffffff00000000;
  local_50 = 0x200000;
  local_4c = 0;
  local_4a = 1;
  local_48 = 0;
  local_40 = 0;
  local_30 = 0;
  local_28 = 0;
  pcVar3 = formatter<fmt::v7::basic_string_view<char>,char,void>::
           parse<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>>
                     ((formatter<fmt::v7::basic_string_view<char>,char,void> *)&local_58,parse_ctx);
  pcVar2 = (parse_ctx->format_str_).data_;
  lVar4 = (long)pcVar3 - (long)pcVar2;
  if (-1 < lVar4) {
    (parse_ctx->format_str_).data_ = pcVar2 + lVar4;
    psVar1 = &(parse_ctx->format_str_).size_;
    *psVar1 = *psVar1 - lVar4;
    iVar5 = formatter<baryonyx::solver_parameters::mode_type,char,void>::
            format<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
                      ((formatter<baryonyx::solver_parameters::mode_type,char,void> *)&local_58,*arg
                       ,ctx);
    (ctx->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
         (buffer<char> *)iVar5.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
    return;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/core.h"
              ,0x146,"negative value");
}

Assistant:

static void format_custom_arg(const void* arg,
                                typename Context::parse_context_type& parse_ctx,
                                Context& ctx) {
    Formatter f;
    parse_ctx.advance_to(f.parse(parse_ctx));
    ctx.advance_to(f.format(*static_cast<const T*>(arg), ctx));
  }